

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpBranchind::printRaw(TypeOpBranchind *this,ostream *s,PcodeOp *op)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(s,(string *)&(this->super_TypeOp).name);
  std::operator<<(poVar1,' ');
  Varnode::printRaw(*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start,s);
  return;
}

Assistant:

void TypeOpBranchind::printRaw(ostream &s,const PcodeOp *op)

{
  s << name << ' ';
  op->getIn(0)->printRaw(s);
}